

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,void **vtt,
          TPZGeoMesh *DestMesh,TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  atomic_int *paVar1;
  _Rb_tree_header *p_Var2;
  void *pvVar3;
  TPZReference *pTVar4;
  long lVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  mapped_type_conflict *pmVar8;
  mapped_type_conflict mVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  stringstream sout;
  long local_1b8 [2];
  ostream local_1a8 [376];
  
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>,vtt + 1,
             DestMesh,&cp->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>,
             gl2lcNdMap,gl2lcElMap);
  pvVar3 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>).super_TPZGeoEl
       = pvVar3;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>).fGeo.
                   super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
            *(long *)((long)pvVar3 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  pTVar4 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar4;
  LOCK();
  paVar1 = &pTVar4->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_1b8[0] = 0;
  TPZVec<long>::Resize(&this->fSubEl,(cp->fSubEl).fNElements,local_1b8);
  if (0 < (cp->fSubEl).fNElements) {
    p_Var2 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
    lVar12 = 0;
    do {
      lVar5 = (cp->fSubEl).fStore[lVar12];
      if (lVar5 == -1) {
        mVar9 = -1;
      }
      else {
        p_Var6 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var2->_M_header;
        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
            p_Var6 = (&p_Var6->_M_left)[(long)*(size_t *)(p_Var6 + 1) < lVar5]) {
          if (lVar5 <= (long)*(size_t *)(p_Var6 + 1)) {
            p_Var10 = p_Var6;
          }
        }
        p_Var11 = p_Var2;
        if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
           (p_Var11 = (_Rb_tree_header *)p_Var10,
           lVar5 < (long)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
          p_Var11 = p_Var2;
        }
        if (p_Var11 == p_Var2) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in - ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "TPZGeoElRefPattern<pzgeom::TPZGeoBlend<TPZGeoPrism>>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZGeoBlend<TPZGeoPrism>]"
                     ,0xde);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," subelement ",0xc);
          poVar7 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," index = ",9);
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," is not in the map.",0x13);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                     ,0x7a);
        }
        pmVar8 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](gl2lcElMap,(cp->fSubEl).fStore + lVar12);
        mVar9 = *pmVar8;
      }
      (this->fSubEl).fStore[lVar12] = mVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (cp->fSubEl).fNElements);
  }
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}